

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O2

bool __thiscall
glcts::anon_unknown_0::BasicAtomicCase2::RunIteration
          (BasicAtomicCase2 *this,uvec3 *param_1,uvec3 *num_groups,bool dispatch_indirect)

{
  CallLogWrapper *this_00;
  GLuint *buffers;
  long size;
  uint uVar1;
  bool bVar2;
  GLuint GVar3;
  GLint location;
  ostream *poVar4;
  void *pvVar5;
  bool *compile_error;
  GLuint i;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  uvec3 global_size;
  string local_1d8;
  GLuint values [8];
  
  if (this->m_program != 0) {
    glu::CallLogWrapper::glDeleteProgram
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
  }
  tcu::operator*((tcu *)&global_size,param_1,num_groups);
  std::__cxx11::stringstream::stringstream((stringstream *)values);
  poVar4 = std::operator<<((ostream *)(values + 4),"\nlayout(local_size_x = ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4,", local_size_y = ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4,", local_size_z = ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4,") in;\nconst uvec3 kGlobalSize = uvec3(");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4,", ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4,", ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4,
                           ");\nlayout(std430, binding = 0) buffer OutputU {\n  uint g_uint_out[");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4,
                           "];\n};\nlayout(std430, binding = 1) buffer OutputI {\n  int data[");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::operator<<(poVar4,
                  "];\n} g_int_out;\nuniform uint g_uint_value[8];\nvoid main() {\n  uint global_index = gl_GlobalInvocationID.x +\n                      gl_GlobalInvocationID.y * kGlobalSize.x +\n                      gl_GlobalInvocationID.z * kGlobalSize.x * kGlobalSize.y;\n  atomicExchange(g_uint_out[global_index], g_uint_value[0]);\n  atomicMin(g_uint_out[global_index], g_uint_value[1]);\n  atomicMax(g_uint_out[global_index], g_uint_value[2]);\n  atomicAnd(g_uint_out[global_index], g_uint_value[3]);\n  atomicOr(g_uint_out[global_index], g_uint_value[4]);\n  if (g_uint_value[0] > 0u) {\n    barrier();\n    atomicXor(g_uint_out[global_index], g_uint_value[5]);\n  }\n  atomicCompSwap(g_uint_out[global_index], g_uint_value[6], g_uint_value[7]);\n\n  atomicExchange(g_int_out.data[global_index], 3);\n  atomicMin(g_int_out.data[global_index], 1);\n  atomicMax(g_int_out.data[global_index], 2);\n  atomicAnd(g_int_out.data[global_index], 0x1);\n  atomicOr(g_int_out.data[global_index], 0x3);\n  atomicXor(g_int_out.data[global_index], 0x1);\n  atomicCompSwap(g_int_out.data[global_index], 0x2, 0x7);\n}"
                 );
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)values);
  GVar3 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,&local_1d8);
  this->m_program = GVar3;
  std::__cxx11::string::~string((string *)&local_1d8);
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,this->m_program);
  bVar2 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,compile_error);
  if (bVar2) {
    uVar7 = num_groups->m_data[0] * param_1->m_data[0] * param_1->m_data[1] * num_groups->m_data[1]
            * param_1->m_data[2] * num_groups->m_data[2];
    buffers = this->m_storage_buffer;
    GVar3 = this->m_storage_buffer[0];
    if (GVar3 == 0) {
      glu::CallLogWrapper::glGenBuffers(this_00,2,buffers);
      GVar3 = *buffers;
    }
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,GVar3);
    size = (ulong)uVar7 * 4;
    glu::CallLogWrapper::glBufferData(this_00,0x90d2,size,(void *)0x0,0x88e8);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,1,this->m_storage_buffer[1]);
    glu::CallLogWrapper::glBufferData(this_00,0x90d2,size,(void *)0x0,0x88e8);
    glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
    values[4] = 3;
    values[5] = 1;
    values[6] = 2;
    values[7] = 7;
    values[0] = 3;
    values[1] = 1;
    values[2] = 2;
    values[3] = 1;
    location = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_uint_value");
    glu::CallLogWrapper::glUniform1uiv(this_00,location,8,values);
    if (dispatch_indirect) {
      GVar3 = this->m_dispatch_buffer;
      if (GVar3 == 0) {
        glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_dispatch_buffer);
        GVar3 = this->m_dispatch_buffer;
      }
      glu::CallLogWrapper::glBindBuffer(this_00,0x90ee,GVar3);
      glu::CallLogWrapper::glBufferData(this_00,0x90ee,0xc,num_groups,0x88e4);
      glu::CallLogWrapper::glDispatchComputeIndirect(this_00,0);
    }
    else {
      glu::CallLogWrapper::glDispatchCompute
                (this_00,num_groups->m_data[0],num_groups->m_data[1],num_groups->m_data[2]);
    }
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,*buffers);
    pvVar5 = glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,size,1);
    bVar2 = true;
    for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
      uVar1 = *(uint *)((long)pvVar5 + uVar6 * 4);
      if (uVar1 != 7) {
        bVar2 = false;
        anon_unknown_0::Output
                  ("uData at index %d is %d should be %d.\n",uVar6 & 0xffffffff,(ulong)uVar1,7);
      }
    }
    glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
    uVar6 = 0;
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[1]);
    pvVar5 = glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,size,1);
    uVar8 = 0;
    if (0 < (int)uVar7) {
      uVar8 = (ulong)uVar7;
    }
    for (; uVar8 != uVar6; uVar6 = uVar6 + 1) {
      uVar7 = *(uint *)((long)pvVar5 + uVar6 * 4);
      if (uVar7 != 7) {
        bVar2 = false;
        anon_unknown_0::Output
                  ("iData at index %d is %d should be %d.\n",uVar6 & 0xffffffff,(ulong)uVar7,7);
      }
    }
    glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool RunIteration(const uvec3& local_size, const uvec3& num_groups, bool dispatch_indirect)
	{
		if (m_program != 0)
			glDeleteProgram(m_program);
		m_program = CreateComputeProgram(GenSource(local_size, num_groups));
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return false;

		const GLuint kBufferSize =
			local_size.x() * num_groups.x() * local_size.y() * num_groups.y() * local_size.z() * num_groups.z();

		if (m_storage_buffer[0] == 0)
			glGenBuffers(2, m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer[0]);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(GLuint) * kBufferSize, NULL, GL_DYNAMIC_DRAW);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_storage_buffer[1]);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(GLint) * kBufferSize, NULL, GL_DYNAMIC_DRAW);

		glUseProgram(m_program);
		GLuint values[8] = { 3u, 1u, 2u, 0x1u, 0x3u, 0x1u, 0x2u, 0x7u };
		glUniform1uiv(glGetUniformLocation(m_program, "g_uint_value"), 8, values);
		if (dispatch_indirect)
		{
			if (m_dispatch_buffer == 0)
				glGenBuffers(1, &m_dispatch_buffer);
			glBindBuffer(GL_DISPATCH_INDIRECT_BUFFER, m_dispatch_buffer);
			glBufferData(GL_DISPATCH_INDIRECT_BUFFER, sizeof(num_groups), &num_groups[0], GL_STATIC_DRAW);
			glDispatchComputeIndirect(0);
		}
		else
		{
			glDispatchCompute(num_groups.x(), num_groups.y(), num_groups.z());
		}
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		bool	res = true;
		GLuint* udata;
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[0]);
		udata = static_cast<GLuint*>(
			glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(GLuint) * kBufferSize, GL_MAP_READ_BIT));
		for (GLuint i = 0; i < kBufferSize; ++i)
		{
			if (udata[i] != 7)
			{
				Output("uData at index %d is %d should be %d.\n", i, udata[i], 7);
				res = false;
			}
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		GLint* idata;
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[1]);
		idata = static_cast<GLint*>(
			glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(GLint) * kBufferSize, GL_MAP_READ_BIT));
		for (GLint i = 0; i < static_cast<GLint>(kBufferSize); ++i)
		{
			if (idata[i] != 7)
			{
				Output("iData at index %d is %d should be %d.\n", i, idata[i], 7);
				res = false;
			}
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);
		return res;
	}